

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli_parser.cpp
# Opt level: O3

char * __thiscall dxil_spv::CLIParser::next_string(CLIParser *this)

{
  char *pcVar1;
  code *pcVar2;
  undefined8 uVar3;
  char buffer [4096];
  char local_1018 [4096];
  
  if (this->argc != 0) {
    pcVar1 = *this->argv;
    this->argc = this->argc + -1;
    this->argv = this->argv + 1;
    return pcVar1;
  }
  pcVar2 = (code *)dxil_spv::get_thread_log_callback();
  if (pcVar2 == (code *)0x0) {
    next_string();
  }
  else {
    builtin_strncpy(local_1018,"Tried to parse string, but nothing left in arguments.\n",0x37);
    uVar3 = dxil_spv::get_thread_log_callback_userdata();
    (*pcVar2)(uVar3,2,local_1018);
  }
  if ((this->cbs).error_handler.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->cbs).error_handler._M_invoker)((_Any_data *)&(this->cbs).error_handler);
  }
  exit(1);
}

Assistant:

const char *CLIParser::next_string()
{
	if (!argc)
	{
		LOGE("Tried to parse string, but nothing left in arguments.\n");
		if (cbs.error_handler)
			cbs.error_handler();
		exit(EXIT_FAILURE);
	}

	const char *ret = *argv;
	argc--;
	argv++;
	return ret;
}